

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_signature.c
# Opt level: O3

value signature_metadata(signature s)

{
  value v;
  value *ppvVar1;
  value pvVar2;
  value pvVar3;
  value *ppvVar4;
  value *ppvVar5;
  value pvVar6;
  size_t length;
  value v_00;
  ulong uVar7;
  set __s;
  size_t *psVar8;
  
  v = value_create_array((value *)0x0,2);
  if (v == (value)0x0) {
    return (value)0x0;
  }
  ppvVar1 = value_to_array(v);
  pvVar2 = value_create_string("ret",3);
  *ppvVar1 = pvVar2;
  if (pvVar2 != (value)0x0) {
    pvVar2 = value_create_map((value *)0x0,1);
    ppvVar1[1] = pvVar2;
    if (pvVar2 != (value)0x0) {
      ppvVar1 = value_to_map(pvVar2);
      pvVar2 = type_metadata(s->ret);
      *ppvVar1 = pvVar2;
      if ((pvVar2 != (value)0x0) &&
         (pvVar2 = value_create_array((value *)0x0,s->count), pvVar2 != (value)0x0)) {
        if ((s->count != 0) && (ppvVar1 = value_to_array(pvVar2), s->count != 0)) {
          psVar8 = &s[1].count;
          uVar7 = 0;
          do {
            pvVar3 = value_create_map((value *)0x0,2);
            ppvVar1[uVar7] = pvVar3;
            v_00 = pvVar2;
            if (pvVar3 == (value)0x0) goto LAB_0011b56f;
            ppvVar4 = value_to_map(pvVar3);
            __s = (set)psVar8[-1];
            pvVar3 = value_create_array((value *)0x0,2);
            if (pvVar3 == (value)0x0) {
LAB_0011b55e:
              *ppvVar4 = (value)0x0;
              goto LAB_0011b56f;
            }
            ppvVar5 = value_to_array(pvVar3);
            pvVar6 = value_create_string("name",4);
            *ppvVar5 = pvVar6;
            if (pvVar6 == (value)0x0) {
LAB_0011b556:
              value_type_destroy(pvVar3);
              goto LAB_0011b55e;
            }
            if (__s == (set)0x0) {
              __s = (set)0x12b33c;
              length = 0;
            }
            else {
              length = strlen((char *)__s);
            }
            pvVar6 = value_create_string((char *)__s,length);
            ppvVar5[1] = pvVar6;
            if (pvVar6 == (value)0x0) goto LAB_0011b556;
            *ppvVar4 = pvVar3;
            pvVar3 = type_metadata((type_conflict)*psVar8);
            ppvVar4[1] = pvVar3;
            if (pvVar3 == (value)0x0) goto LAB_0011b56f;
            uVar7 = uVar7 + 1;
            psVar8 = psVar8 + 3;
          } while (uVar7 < s->count);
        }
        v_00 = value_create_array((value *)0x0,2);
        if (v_00 == (value)0x0) {
          v_00 = (value)0x0;
        }
        else {
          ppvVar1 = value_to_array(v_00);
          pvVar3 = value_create_string("args",4);
          *ppvVar1 = pvVar3;
          if (pvVar3 != (value)0x0) {
            ppvVar1[1] = pvVar2;
            pvVar2 = value_create_map((value *)0x0,2);
            if (pvVar2 != (value)0x0) {
              ppvVar1 = value_to_map(pvVar2);
              *ppvVar1 = v;
              ppvVar1[1] = v_00;
              return pvVar2;
            }
            value_type_destroy(v);
            v = v_00;
            goto LAB_0011b577;
          }
        }
LAB_0011b56f:
        value_type_destroy(v_00);
      }
    }
  }
LAB_0011b577:
  value_type_destroy(v);
  return (value)0x0;
}

Assistant:

value signature_metadata(signature s)
{
	value ret, args, sig;
	value *sig_map;

	/* Create return array */
	ret = signature_metadata_return(s);

	if (ret == NULL)
	{
		return NULL;
	}

	/* Create arguments map */
	args = signature_metadata_args(s);

	if (args == NULL)
	{
		value_type_destroy(ret);

		return NULL;
	}

	/* Create signature map (return type + args) */
	sig = value_create_map(NULL, 2);

	if (sig == NULL)
	{
		value_type_destroy(ret);
		value_type_destroy(args);

		return NULL;
	}

	sig_map = value_to_map(sig);

	sig_map[0] = ret;
	sig_map[1] = args;

	return sig;
}